

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O2

void report_errors(void)

{
  qpdf_error p_Var1;
  uint __line;
  int iVar2;
  char *__assertion;
  
  while( true ) {
    iVar2 = qpdf_more_warnings(qpdf);
    if (iVar2 == 0) break;
    p_Var1 = (qpdf_error)qpdf_next_warning();
    print_error("warning",qpdf,p_Var1);
  }
  iVar2 = qpdf_has_error(qpdf);
  p_Var1 = (qpdf_error)qpdf_get_error(qpdf);
  if (iVar2 == 0) {
    if (p_Var1 == (qpdf_error)0x0) {
      iVar2 = qpdf_get_error_code(qpdf,0);
      if (iVar2 == 0) {
        qpdf_get_error_full_text(qpdf,0);
        qpdf_get_error_filename(qpdf,0);
        qpdf_get_error_file_position(qpdf,0);
        qpdf_get_error_message_detail(qpdf,0);
        return;
      }
      __assertion = "qpdf_get_error_code(qpdf, e) == qpdf_e_success";
      __line = 0x3c;
    }
    else {
      __assertion = "e == 0";
      __line = 0x3b;
    }
  }
  else {
    iVar2 = qpdf_has_error(qpdf);
    if (iVar2 == 0) {
      print_error("error",qpdf,p_Var1);
      return;
    }
    __assertion = "qpdf_has_error(qpdf) == QPDF_FALSE";
    __line = 0x37;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,__line,"void report_errors()");
}

Assistant:

static void
report_errors()
{
    qpdf_error e = 0;
    while (qpdf_more_warnings(qpdf)) {
        e = qpdf_next_warning(qpdf);
        print_error("warning", qpdf, e);
    }
    if (qpdf_has_error(qpdf)) {
        e = qpdf_get_error(qpdf);
        assert(qpdf_has_error(qpdf) == QPDF_FALSE);
        print_error("error", qpdf, e);
    } else {
        e = qpdf_get_error(qpdf);
        assert(e == 0);
        assert(qpdf_get_error_code(qpdf, e) == qpdf_e_success);
        // Call these to ensure that they can be called on a null
        // error pointer.
        (void)qpdf_get_error_full_text(qpdf, e);
        (void)qpdf_get_error_filename(qpdf, e);
        (void)qpdf_get_error_file_position(qpdf, e);
        (void)qpdf_get_error_message_detail(qpdf, e);
    }
}